

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

void __thiscall GusteauChapter2UI::Run(GusteauChapter2UI *this,ApplicationContextBase *ac)

{
  Blackboard *b;
  bool bVar1;
  int id;
  Data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  long lVar2;
  long lVar3;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ImGui::Text("Hello Chapter 2");
  local_48._M_dataplus._M_p = (pointer)0x0;
  bVar1 = ImGui::Button("Quit",(ImVec2 *)&local_48);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi,"quit",0);
  }
  sprintf(Run::tick_text,"tick: %d",
          (ulong)*(uint *)&ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         );
  ImGui::TextUnformatted(Run::tick_text,(char *)0x0);
  ImGui::InputText("Line: ",Run::buff,0x100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
  local_48._M_dataplus._M_p = (pointer)0x0;
  bVar1 = ImGui::Button("Append",(ImVec2 *)&local_48);
  if (bVar1) {
    b = *(Blackboard **)&ac[2].join_now;
    this_00 = (Data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,Run::buff,&local_49);
    Data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Data
              (this_00,&local_48);
    id = blackboard_new_entry(b,(TypedData *)this_00);
    std::__cxx11::string::~string((string *)&local_48);
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi,"append_line",id);
  }
  local_48._M_dataplus._M_p = (pointer)0x0;
  bVar1 = ImGui::Button("Pop",(ImVec2 *)&local_48);
  if (bVar1) {
    csp_emit((CSP *)ac[2].super_enable_shared_from_this<ApplicationContextBase>._M_weak_this.
                    super___weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi,"pop_line",0);
  }
  lVar2 = 0;
  ImGui::TextUnformatted("------ LINES ------",(char *)0x0);
  lVar3 = (long)ac[2]._vptr_ApplicationContextBase -
          (long)ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          >> 5;
  while (bVar1 = lVar3 != 0, lVar3 = lVar3 + -1, bVar1) {
    ImGui::TextUnformatted
              (*(char **)((long)&(ac[1].ui.super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base + lVar2),(char *)0x0);
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

virtual void Run(ApplicationContextBase& ac) override
    {
        auto ac_ptr = reinterpret_cast<ApplicationContext*>(&ac);

        ImGui::Text("Hello Chapter 2");
        if (ImGui::Button("Quit"))
        {
///>
/// The UI in chapter two uses the CSP mechanism to do it's work,
/// instead of setting variables on the ApplicationContext as it did previously.
///<C++
            csp_emit(ac_ptr->csp, "quit", 0);
        }
        static char tick_text[128];
        sprintf(tick_text, "tick: %d", ac_ptr->count);
        ImGui::TextUnformatted(tick_text);

        static char buff[256];
        ImGui::InputText("Line: ", buff, sizeof(buff));
        if (ImGui::Button("Append"))
        {
            int id = blackboard_new_entry(ac_ptr->blackboard, new Data<std::string>(std::string{buff}));
            csp_emit(ac_ptr->csp, "append_line", id);
        }
        if (ImGui::Button("Pop"))
        {
            csp_emit(ac_ptr->csp, "pop_line", 0);
        }
        ImGui::TextUnformatted("------ LINES ------");
        size_t sz = ac_ptr->lines.size();
        for (auto i = 0; i < sz; ++i)
        {
            ImGui::TextUnformatted(ac_ptr->lines[i].c_str());
        }
    }